

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_dc_left_predictor_32x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t *in_RCX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  __m256i row;
  __m128i r;
  __m128i zero;
  __m128i eight;
  __m128i sum;
  uint8_t *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  undefined8 uStack_78;
  
  dc_sum_16_sse2(in_RCX);
  auVar1 = vpinsrw_avx(ZEXT216(8),8,1);
  auVar1 = vpinsrw_avx(auVar1,8,2);
  auVar1 = vpinsrw_avx(auVar1,8,3);
  auVar1 = vpinsrw_avx(auVar1,8,4);
  auVar1 = vpinsrw_avx(auVar1,8,5);
  auVar1 = vpinsrw_avx(auVar1,8,6);
  auVar1 = vpinsrw_avx(auVar1,8,7);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1 = vpaddw_avx(auVar2,auVar1);
  auVar1 = vpsraw_avx(auVar1,ZEXT416(4));
  uStack_78 = SUB168(ZEXT816(0),4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_78;
  auVar1 = vpshufb_avx(auVar1,auVar3 << 0x40);
  row_store_32xh(auVar1._0_8_,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
                 SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,8));
  return;
}

Assistant:

void aom_dc_left_predictor_32x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  __m128i sum = dc_sum_16_sse2(left);
  (void)above;

  const __m128i eight = _mm_set1_epi16(8);
  sum = _mm_add_epi16(sum, eight);
  sum = _mm_srai_epi16(sum, 4);
  const __m128i zero = _mm_setzero_si128();
  const __m128i r = _mm_shuffle_epi8(sum, zero);
  const __m256i row = _mm256_inserti128_si256(_mm256_castsi128_si256(r), r, 1);
  row_store_32xh(&row, 16, dst, stride);
}